

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

float __thiscall deqp::gls::DrawTest::getCoordScale(DrawTest *this,DrawTestSpec *spec)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  const_reference __src;
  GLValue GVar4;
  float local_74;
  byte local_6d;
  GLValue local_68;
  float local_54;
  float local_50;
  float max;
  float attrMaxValue;
  int iStack_44;
  bool isPositionAttr;
  AttributeSpec attribSpec;
  int arrayNdx;
  float maxValue;
  DrawTestSpec *spec_local;
  DrawTest *this_local;
  
  attribSpec.useDefaultAttribute = false;
  attribSpec.additionalPositionAttribute = false;
  attribSpec.bgraComponentOrder = true;
  attribSpec._39_1_ = 0x3f;
  for (attribSpec.instanceDivisor = 0; iVar1 = attribSpec.instanceDivisor,
      sVar3 = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::size(&spec->attribs), iVar1 < (int)sVar3;
      attribSpec.instanceDivisor = attribSpec.instanceDivisor + 1) {
    __src = std::
            vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ::operator[](&spec->attribs,(long)attribSpec.instanceDivisor);
    memcpy(&attrMaxValue,__src,0x28);
    local_6d = 1;
    if (attribSpec.instanceDivisor != 0) {
      local_6d = attribSpec._29_1_;
    }
    max._3_1_ = local_6d & 1;
    local_50 = 0.0;
    if (max._3_1_ != 0) {
      if (attrMaxValue == 1.4013e-44) {
        if (((byte)attribSpec.offset & 1) == 0) {
          local_50 = 1024.0;
        }
        else {
          local_50 = 1.0;
        }
      }
      else if (attrMaxValue == 1.54143e-44) {
        if (((byte)attribSpec.offset & 1) == 0) {
          local_50 = 512.0;
        }
        else {
          local_50 = 1.0;
        }
      }
      else {
        GVar4 = anon_unknown_1::GLValue::getMaxValue((InputType)attrMaxValue);
        local_68.field_1 = GVar4.field_1;
        local_68.type = GVar4.type;
        local_54 = anon_unknown_1::GLValue::toFloat(&local_68);
        if ((((byte)attribSpec.offset & 1) == 0) ||
           (bVar2 = anon_unknown_1::inputTypeIsFloatType((InputType)attrMaxValue), bVar2)) {
          local_74 = local_54 * 1.1;
        }
        else {
          local_74 = 1.0;
        }
        local_50 = local_74 + local_50;
      }
      if ((((iStack_44 == 2) || (iStack_44 == 3)) || (iStack_44 == 7)) ||
         (((iStack_44 == 8 || (iStack_44 == 10)) || (iStack_44 == 0xb)))) {
        local_50 = local_50 * 2.0;
      }
      attribSpec._36_4_ = local_50 + (float)attribSpec._36_4_;
    }
  }
  return 1.0 / (float)attribSpec._36_4_;
}

Assistant:

float DrawTest::getCoordScale (const DrawTestSpec& spec) const
{
	float maxValue = 1.0f;

	for (int arrayNdx = 0; arrayNdx < (int)spec.attribs.size(); arrayNdx++)
	{
		DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[arrayNdx];
		const bool					isPositionAttr	= (arrayNdx == 0) || (attribSpec.additionalPositionAttribute);
		float						attrMaxValue	= 0;

		if (!isPositionAttr)
			continue;

		if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
		{
			if (attribSpec.normalize)
				attrMaxValue += 1.0f;
			else
				attrMaxValue += 1024.0f;
		}
		else if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
		{
			if (attribSpec.normalize)
				attrMaxValue += 1.0f;
			else
				attrMaxValue += 512.0f;
		}
		else
		{
			const float max = GLValue::getMaxValue(attribSpec.inputType).toFloat();

			attrMaxValue += (attribSpec.normalize && !inputTypeIsFloatType(attribSpec.inputType)) ? (1.0f) : (max * 1.1f);
		}

		if (attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_VEC3 || attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_VEC4
			|| attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_IVEC3 || attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_IVEC4
			|| attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_UVEC3 || attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_UVEC4)
				attrMaxValue *= 2;

		maxValue += attrMaxValue;
	}

	return 1.0f / maxValue;
}